

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::emitFinishedWithError
          (QHttpNetworkConnectionChannel *this,NetworkError error,char *message)

{
  long lVar1;
  bool bVar2;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar3;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *currentReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *httpMessagePair;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> h2RequestsToSendCopy;
  QHttpNetworkReply *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x38) != 0) {
    in_stack_ffffffffffffff68 = *(char **)(in_RDI + 0x38);
    in_stack_ffffffffffffff74 = in_ESI;
    tr(in_stack_ffffffffffffff68,
       (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    QHttpNetworkReply::finishedWithError
              ((QHttpNetworkReply *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (NetworkError)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (QString *)in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x2fc9bf);
  }
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             in_stack_ffffffffffffff58);
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    bVar2 = ::operator!=((const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (const_iterator *)in_stack_ffffffffffffff58);
    if (!bVar2) break;
    ppVar3 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
             operator*((const_iterator *)0x2fca6a);
    in_stack_ffffffffffffff58 = ppVar3->second;
    in_stack_ffffffffffffff64 = in_ESI;
    tr(in_stack_ffffffffffffff68,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),
       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    QHttpNetworkReply::finishedWithError
              ((QHttpNetworkReply *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (NetworkError)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (QString *)in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x2fcac2);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::operator++
              ((const_iterator *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fcade);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::emitFinishedWithError(QNetworkReply::NetworkError error,
                                                          const char *message)
{
    if (reply)
        emit reply->finishedWithError(error, QHttpNetworkConnectionChannel::tr(message));
    const auto h2RequestsToSendCopy = h2RequestsToSend;
    for (const auto &httpMessagePair : h2RequestsToSendCopy) {
        QHttpNetworkReply *currentReply = httpMessagePair.second;
        Q_ASSERT(currentReply);
        emit currentReply->finishedWithError(error, QHttpNetworkConnectionChannel::tr(message));
    }
}